

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
SquareRootUnscentedKalmanFilter_init_Test::TestBody(SquareRootUnscentedKalmanFilter_init_Test *this)

{
  bool bVar1;
  bool bVar2;
  char *in_R9;
  undefined1 local_214 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> ukfMatrix;
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar__1;
  
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_214,1.0,2.0,1.0);
  bVar1 = Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                    ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                     &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info._0_1_ = bVar1;
  if (bVar1) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
               (internal *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,
               (AssertionResult *)"ukf.S.isIdentity()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xe,(char *)ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                            super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                            super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__1.message_,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    if ((float *)ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                 super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                 super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ !=
        (float *)((long)&ukfMatrix.
                         super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         super_KalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.x.
                         super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data + 8U)) {
      operator_delete((void *)ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                              super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                              super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_);
    }
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (!bVar1) {
      return;
    }
  }
  Kalman::SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
              super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
              super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,1.0,2.0,1.0);
  bVar1 = Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::isIdentity
                    ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                     &ukfMatrix.
                      super_UnscentedKalmanFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.gamma);
  local_30.ptr_._0_1_ = bVar1;
  gtest_ar__1.success_ = false;
  gtest_ar__1._1_7_ = 0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__1.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info,(internal *)&local_30,
               (AssertionResult *)"ukfMatrix.S.isIdentity()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0x12,(char *)CONCAT71(stack0xffffffffffffffa9,
                                      (undefined1)
                                      ukfMatrix.
                                      super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                      .super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                                      super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info));
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar__1.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(stack0xffffffffffffffa9,
                    (undefined1)
                    ukfMatrix.super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                    super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info) != &gtest_ar_.message_
       ) {
      operator_delete((undefined1 *)
                      CONCAT71(stack0xffffffffffffffa9,
                               (undefined1)
                               ukfMatrix.
                               super_SquareRootFilterBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               super_SquareRootBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.S.
                               super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info));
    }
    if (gtest_ar__1.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar__1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar__1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, init) {
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(1,2,1);
    ASSERT_TRUE(ukf.S.isIdentity()); // S should be identity

    // Same as above, but with general matrix type instead of vector
    auto ukfMatrix = SquareRootUnscentedKalmanFilter<Matrix<T, 3, 1>>(1,2,1);
    ASSERT_TRUE(ukfMatrix.S.isIdentity()); // S should be identity
}